

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDComponentPtr __thiscall ON_SubDComponentPtr::NextComponent(ON_SubDComponentPtr *this)

{
  uint uVar1;
  ON_SubDComponentPtr OVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = this->m_ptr;
  uVar1 = (uint)uVar3 & 6;
  OVar2.m_ptr = (ON__UINT_PTR)uVar1;
  switch(uVar1) {
  case 0:
    goto switchD_005e0eda_caseD_0;
  case 2:
    uVar4 = uVar3 & 0xfffffffffffffff8;
    if (uVar4 != 0) {
      if (*(ulong *)(uVar4 + 0x58) == 0) {
        OVar2 = (ON_SubDComponentPtr)0;
      }
      else {
        OVar2.m_ptr = *(ulong *)(uVar4 + 0x58) | 2;
      }
    }
    if (uVar4 != 0) {
      return (ON_SubDComponentPtr)OVar2.m_ptr;
    }
    break;
  case 6:
    goto switchD_005e0eda_caseD_6;
  }
  uVar4 = uVar3 & 0xfffffffffffffff8;
  if (uVar4 != 0) {
    if (*(ulong *)(uVar4 + 0x58) == 0) {
      OVar2 = (ON_SubDComponentPtr)0;
    }
    else {
      OVar2.m_ptr = *(ulong *)(uVar4 + 0x58) | 4;
    }
  }
  if (uVar4 == 0) {
switchD_005e0eda_caseD_6:
    uVar3 = uVar3 & 0xfffffffffffffff8;
    if (uVar3 != 0) {
      if (*(ulong *)(uVar3 + 0x58) == 0) {
        OVar2 = (ON_SubDComponentPtr)0;
      }
      else {
        OVar2.m_ptr = *(ulong *)(uVar3 + 0x58) | 6;
      }
    }
    if (uVar3 == 0) {
switchD_005e0eda_caseD_0:
      return (ON_SubDComponentPtr)0;
    }
  }
  return (ON_SubDComponentPtr)OVar2.m_ptr;
}

Assistant:

const ON_SubDComponentPtr ON_SubDComponentPtr::NextComponent() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = ON_SUBD_VERTEX_POINTER(m_ptr);
    if (nullptr != v)
      return ON_SubDComponentPtr::Create(v->m_next_vertex);
  }
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr != e)
      return ON_SubDComponentPtr::Create(e->m_next_edge);
  }
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(m_ptr);
    if (nullptr != f)
      return ON_SubDComponentPtr::Create(f->m_next_face);
  }
  default:
    break;
  }
  return ON_SubDComponentPtr::Null;
}